

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O3

void __thiscall
Diligent::RefCntWeakPtr<Diligent::IAsyncTask>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::IAsyncTask> *this,IAsyncTask *pObj)

{
  int iVar1;
  undefined4 extraout_var;
  RefCountersImpl *pSrcPtr;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (pObj != (IAsyncTask *)0x0) {
    iVar1 = (*(pObj->super_IObject)._vptr_IObject[3])(pObj);
    pSrcPtr = (RefCountersImpl *)CONCAT44(extraout_var,iVar1);
    if (pSrcPtr != (RefCountersImpl *)0x0) {
      CheckDynamicType<Diligent::RefCountersImpl,Diligent::IReferenceCounters>
                ((IReferenceCounters *)pSrcPtr);
    }
    this->m_pRefCounters = pSrcPtr;
    LOCK();
    (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i =
         (pSrcPtr->m_NumWeakReferences).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }